

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O1

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetSubjectCount(VClient *this,uint *o_rSubjectCount)

{
  Enum EVar1;
  bool bVar2;
  Enum GetResult;
  scoped_lock Lock;
  Enum local_24;
  unique_lock<boost::recursive_mutex> local_20;
  
  local_20.m = &this->m_FrameMutex;
  local_20.is_locked = false;
  boost::unique_lock<boost::recursive_mutex>::lock(&local_20);
  local_24 = Success;
  ClientUtils::Clear(o_rSubjectCount);
  bVar2 = InitGet(this,&local_24);
  EVar1 = local_24;
  if (bVar2) {
    *o_rSubjectCount =
         (int)((ulong)((long)(this->m_LatestFrame).m_Subjects.
                             super__Vector_base<ViconCGStream::VSubjectInfo,_std::allocator<ViconCGStream::VSubjectInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_LatestFrame).m_Subjects.
                            super__Vector_base<ViconCGStream::VSubjectInfo,_std::allocator<ViconCGStream::VSubjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x11111111;
  }
  if (local_20.is_locked == true) {
    boost::recursive_mutex::unlock(local_20.m);
  }
  return EVar1;
}

Assistant:

Result::Enum VClient::GetSubjectCount( unsigned int & o_rSubjectCount ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  
  Result::Enum GetResult = Result::Success;
  if ( InitGet( GetResult, o_rSubjectCount ) )
  {
    o_rSubjectCount = static_cast< unsigned int >( m_LatestFrame.m_Subjects.size() );
  }

  return GetResult;
}